

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4_bzip2_rpm.c
# Opt level: O3

void test_read_format_cpio_svr4_bzip2_rpm(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  char *pcVar3;
  time_t tVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                   ,L'\\',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_bzip2(_a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                   ,L'_');
    test_skipping("bzip2 reading not fully supported on this platform");
    iVar1 = archive_read_free(_a);
    wVar2 = L'`';
  }
  else {
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'c',0,"ARCHIVE_OK",(long)iVar1,"r",_a);
    iVar1 = archive_read_support_filter_rpm(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_rpm(a)",_a);
    iVar1 = archive_read_support_format_all(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",_a);
    extract_reference_file("test_read_format_cpio_svr4_bzip2_rpm.rpm");
    wVar2 = archive_read_open_filename(_a,"test_read_format_cpio_svr4_bzip2_rpm.rpm",2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'h',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 2)",_a
                       );
    iVar1 = archive_read_next_header(_a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'j',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
               ,L'k',"./etc/file1","\"./etc/file1\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0
               ,L'\0');
    tVar4 = archive_entry_mtime(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'l',0x15181,"86401",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(_a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
               ,L'n',"./etc/file2","\"./etc/file2\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0
               ,L'\0');
    tVar4 = archive_entry_mtime(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'o',0x15181,"86401",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(_a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
    pcVar3 = archive_entry_pathname(local_38);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
               ,L'q',"./etc/file3","\"./etc/file3\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0
               ,L'\0');
    tVar4 = archive_entry_mtime(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'r',0x15181,"86401",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L's',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L't',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",_a);
    iVar1 = archive_read_next_header(_a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'w',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",_a);
    iVar1 = archive_filter_code(_a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'z',(long)iVar1,"archive_filter_code(a, 0)",2,"ARCHIVE_FILTER_BZIP2",
                        (void *)0x0);
    pcVar3 = archive_filter_name(_a,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
               ,L'{',pcVar3,"archive_filter_name(a, 0)","bzip2","\"bzip2\"",(void *)0x0,L'\0');
    iVar1 = archive_format(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'|',(long)iVar1,"archive_format(a)",0x10004,
                        "ARCHIVE_FORMAT_CPIO_SVR4_NOCRC",(void *)0x0);
    iVar1 = archive_read_close(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                        ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(_a);
    wVar2 = L'\x7f';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_cpio_svr4_bzip2_rpm.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4_bzip2_rpm)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_cpio_svr4_bzip2_rpm.rpm";
	int r;

	assert((a = archive_read_new()) != NULL);
        r = archive_read_support_filter_bzip2(a);
	if (r == ARCHIVE_WARN) {
		skipping("bzip2 reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
        }
	assertEqualIntA(a, ARCHIVE_OK, r);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_rpm(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file1", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file2", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("./etc/file3", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_BZIP2);
	assertEqualString(archive_filter_name(a, 0), "bzip2");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_SVR4_NOCRC);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}